

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O2

void api_dynamic_suite::dynamic_size(void)

{
  initializer_list<int> input;
  size_type local_88 [3];
  undefined4 local_6c;
  int array [4];
  circular_view<int,_18446744073709551615UL> span;
  
  span.member.data = array;
  array[0] = 0;
  array[1] = 0;
  array[2] = 0;
  array[3] = 0;
  span.member.cap = 4;
  span.member.size = 0;
  span.member.next = 4;
  local_88[0] = 0;
  local_6c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xc6,"void api_dynamic_suite::dynamic_size()",local_88,&local_6c);
  local_88[0] = 0x160000000b;
  local_88[1] = 0x2c00000021;
  input._M_len = 4;
  input._M_array = (iterator)local_88;
  vista::circular_view<int,_18446744073709551615UL>::assign(&span,input);
  local_88[0] = span.member.size;
  local_6c = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,200,"void api_dynamic_suite::dynamic_size()",local_88,&local_6c);
  vista::circular_view<int,_18446744073709551615UL>::push_back(&span,0x37);
  local_88[0] = span.member.size;
  local_6c = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xca,"void api_dynamic_suite::dynamic_size()",local_88,&local_6c);
  return;
}

Assistant:

void dynamic_size()
{
    int array[4] = {};
    circular_view<int> span(array);
    BOOST_TEST_EQ(span.size(), 0);
    span = {11, 22, 33, 44};
    BOOST_TEST_EQ(span.size(), 4);
    span.push_back(55);
    BOOST_TEST_EQ(span.size(), 4);
}